

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

optional<tinyusdz::Kind> *
tinyusdz::KindFromString(optional<tinyusdz::Kind> *__return_storage_ptr__,string *str)

{
  bool bVar1;
  
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str
                            ,"model");
  if (bVar1) {
    __return_storage_ptr__->has_value_ = true;
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              str,"group");
    if (bVar1) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Kind>)0x1;
      return __return_storage_ptr__;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              str,"assembly");
    if (bVar1) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Kind>)0x2;
      return __return_storage_ptr__;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              str,"component");
    if (bVar1) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Kind>)0x3;
      return __return_storage_ptr__;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              str,"subcomponent");
    if (bVar1) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Kind>)0x4;
      return __return_storage_ptr__;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              str,"sceneLibrary");
    if (bVar1) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Kind>)0x5;
      return __return_storage_ptr__;
    }
    if (str->_M_string_length != 0) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Kind>)0x6;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->has_value_ = false;
  }
  __return_storage_ptr__->contained = (storage_t<tinyusdz::Kind>)0x0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Kind> KindFromString(const std::string &str) {
  if (str == "model") {
    return Kind::Model;
  } else if (str == "group") {
    return Kind::Group;
  } else if (str == "assembly") {
    return Kind::Assembly;
  } else if (str == "component") {
    return Kind::Component;
  } else if (str == "subcomponent") {
    return Kind::Subcomponent;
  } else if (str == "sceneLibrary") {
    // https://developer.apple.com/documentation/arkit/usdz_schemas_for_ar/scenelibrary
    return Kind::SceneLibrary;
  } else if (str.empty()) {
    return nonstd::nullopt;
  } else {
    return Kind::UserDef;
  }
}